

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,QCborSimpleType st)

{
  int *piVar1;
  bool bVar2;
  DataPointer *pDVar3;
  storage_type *psVar4;
  storage_type *psVar5;
  uint in_EDX;
  undefined7 in_register_00000031;
  QDebug *dbg_00;
  QString *this;
  Stream *pSVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QDebugStateSaver saver;
  QDebugStateSaver local_50;
  QString local_48;
  long local_30;
  
  dbg_00 = (QDebug *)CONCAT71(in_register_00000031,st);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_50,dbg_00);
  psVar4 = (storage_type *)(ulong)(in_EDX - 0x14);
  if (in_EDX - 0x14 < 4) {
    pcVar7 = "False";
    bVar2 = false;
    psVar5 = (storage_type *)
             ((long)&switchD_002eaac7::switchdataD_004e7204 +
             (long)(int)(&switchD_002eaac7::switchdataD_004e7204)[(long)psVar4]);
    switch(psVar4) {
    case (storage_type *)0x0:
      goto switchD_002eaac7_caseD_14;
    case (storage_type *)0x1:
      pcVar7 = "True";
      break;
    case (storage_type *)0x2:
      pcVar7 = "Null";
      break;
    case (storage_type *)0x3:
      pcVar7 = "Undefined";
    }
    bVar2 = false;
  }
  else {
    bVar2 = true;
    pcVar7 = (char *)0x0;
    psVar5 = psVar4;
  }
switchD_002eaac7_caseD_14:
  pSVar6 = dbg_00->stream;
  pSVar6->space = false;
  if (bVar2) {
    ba.m_data = psVar5;
    ba.m_size = (qsizetype)"QCborSimpleType(";
    QString::fromUtf8(&local_48,(QString *)0x10,ba);
    QTextStream::operator<<(&pSVar6->ts,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (dbg_00->stream->space == true) {
      QTextStream::operator<<(&dbg_00->stream->ts,' ');
    }
    QTextStream::operator<<(&dbg_00->stream->ts,in_EDX & 0xff);
    if (dbg_00->stream->space == true) {
      QTextStream::operator<<(&dbg_00->stream->ts,' ');
    }
    QTextStream::operator<<(&dbg_00->stream->ts,')');
    pSVar6 = dbg_00->stream;
    if (pSVar6->space != true) goto LAB_002eac52;
  }
  else {
    ba_00.m_data = psVar5;
    ba_00.m_size = (qsizetype)"QCborSimpleType::";
    QString::fromUtf8(&local_48,(QString *)0x11,ba_00);
    QTextStream::operator<<(&pSVar6->ts,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (dbg_00->stream->space == true) {
      QTextStream::operator<<(&dbg_00->stream->ts,' ');
    }
    pSVar6 = dbg_00->stream;
    this = (QString *)0xffffffffffffffff;
    do {
      pDVar3 = &this->d;
      this = (QString *)((long)&(this->d).d + 1);
    } while ((pcVar7 + 1)[(long)&pDVar3->d] != '\0');
    ba_01.m_data = psVar5;
    ba_01.m_size = (qsizetype)pcVar7;
    QString::fromUtf8(&local_48,this,ba_01);
    QTextStream::operator<<(&pSVar6->ts,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    pSVar6 = dbg_00->stream;
    if (pSVar6->space == false) goto LAB_002eac52;
  }
  QTextStream::operator<<(&pSVar6->ts,' ');
LAB_002eac52:
  pSVar6 = dbg_00->stream;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pSVar6;
  piVar1 = &pSVar6->ref;
  *piVar1 = *piVar1 + 1;
  QDebugStateSaver::~QDebugStateSaver(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (QDebug)dbg.stream;
}

Assistant:

QDebug operator<<(QDebug dbg, QCborSimpleType st)
{
    QDebugStateSaver saver(dbg);
    const char *id = qt_cbor_simpletype_id(st);
    if (id)
        return dbg.nospace() << "QCborSimpleType::" << id;

    return dbg.nospace() << "QCborSimpleType(" << uint(st) << ')';
}